

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void lscpp::protocol::from_json(json *j,ClientCapabilities *p)

{
  bool bVar1;
  const_iterator local_60;
  const_iterator local_40;
  
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[10],_0>(&local_40,j,(char (*) [10])0x465d1d);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend(&local_60,j);
  bVar1 = nlohmann::json_abi_v3_11_2::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_40,&local_60);
  if (bVar1) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)j,"workspace");
    if ((p->workspace).
        super__Optional_base<lscpp::protocol::WorkspaceClientCapabilities,_true,_true>._M_payload.
        super__Optional_payload_base<lscpp::protocol::WorkspaceClientCapabilities>._M_engaged ==
        false) {
      (p->workspace).super__Optional_base<lscpp::protocol::WorkspaceClientCapabilities,_true,_true>.
      _M_payload.super__Optional_payload_base<lscpp::protocol::WorkspaceClientCapabilities>.
      _M_engaged = true;
    }
  }
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::find<const_char_(&)[13],_0>(&local_40,j,(char (*) [13])"textDocument");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend(&local_60,j);
  bVar1 = nlohmann::json_abi_v3_11_2::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    (&local_40,&local_60);
  if (bVar1) {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)j,"textDocument");
    if ((p->textDocument).
        super__Optional_base<lscpp::protocol::TextDocumentClientCapabilities,_true,_true>._M_payload
        .super__Optional_payload_base<lscpp::protocol::TextDocumentClientCapabilities>._M_engaged ==
        false) {
      (p->textDocument).
      super__Optional_base<lscpp::protocol::TextDocumentClientCapabilities,_true,_true>._M_payload.
      super__Optional_payload_base<lscpp::protocol::TextDocumentClientCapabilities>._M_engaged =
           true;
    }
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, protocol::ClientCapabilities &p) {
  //   from_json(j, static_cast<Message&>(m));
  if (j.find("workspace") != j.end()) {
    protocol::WorkspaceClientCapabilities workspace;
    j["workspace"].get_to(workspace);
    p.workspace = workspace;
  }
  if (j.find("textDocument") != j.end()) {
    protocol::TextDocumentClientCapabilities textDocument;
    j["textDocument"].get_to(textDocument);
    p.textDocument = textDocument;
  }
}